

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction_base.cpp
# Opt level: O2

vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *
cfd::api::TransactionApiBase::CreateMultisigSignatureData
          (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__return_storage_ptr__
          ,vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_list,
          Script *redeem_script)

{
  bool bVar1;
  iterator __position;
  CfdException *this;
  pointer this_00;
  pointer this_01;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  Pubkey related_pubkey;
  string pubkey_hex;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  undefined1 local_c8 [32];
  SignParameter sign_param;
  
  core::ScriptUtil::ExtractPubkeysFromMultisigScript(&pubkeys,redeem_script,(uint32_t *)0x0);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            (&sign_params,sign_list);
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01 = pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (this_01 ==
        pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_00 = sign_params.
                super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
                super__Vector_impl_data._M_start;
      while( true ) {
        if (this_00 ==
            sign_params.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
                    (&sign_params);
          std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&pubkeys);
          return __return_storage_ptr__;
        }
        SignParameter::GetRelatedPubkey((Pubkey *)&sign_param,this_00);
        bVar1 = core::Pubkey::IsValid((Pubkey *)&sign_param);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sign_param);
        if (bVar1) break;
        SignParameter::ConvertToSignature(&sign_param.data_,this_00);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
        emplace_back<cfd::core::ByteData>(__return_storage_ptr__,&sign_param.data_);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sign_param);
        this_00 = this_00 + 1;
      }
      local_c8._0_8_ = "cfdapi_transaction_base.cpp";
      local_c8._8_4_ = 0x16d;
      local_c8._16_8_ = "CreateMultisigSignatureData";
      SignParameter::GetRelatedPubkey(&related_pubkey,this_00);
      core::Pubkey::GetHex_abi_cxx11_((string *)&sign_param,&related_pubkey);
      core::Script::GetHex_abi_cxx11_(&pubkey_hex,redeem_script);
      core::logger::warn<std::__cxx11::string,std::__cxx11::string_const>
                ((CfdSourceLocation *)local_c8,
                 "Failed to CreateMultisigSignatureData. Missing related pubkey in script.: relatedPubkey={}, script={}"
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sign_param,
                 &pubkey_hex);
      std::__cxx11::string::~string((string *)&pubkey_hex);
      std::__cxx11::string::~string((string *)&sign_param);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&related_pubkey);
      this = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&sign_param,
                 "Missing related pubkey in script. Check your signature and pubkey pair.",
                 (allocator *)&pubkey_hex);
      core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&sign_param);
      __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::Pubkey::GetHex_abi_cxx11_(&pubkey_hex,this_01);
    __position._M_current =
         sign_params.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
         _M_impl.super__Vector_impl_data._M_start;
    while (__position._M_current !=
           sign_params.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
      SignParameter::SignParameter(&sign_param,__position._M_current);
      SignParameter::GetRelatedPubkey(&related_pubkey,&sign_param);
      bVar1 = core::Pubkey::IsValid(&related_pubkey);
      if (bVar1) {
        core::Pubkey::GetHex_abi_cxx11_((string *)local_c8,&related_pubkey);
        bVar1 = std::operator!=((string *)local_c8,&pubkey_hex);
        std::__cxx11::string::~string((string *)local_c8);
        if (bVar1) goto LAB_00339359;
        __position = std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::erase
                               (&sign_params,__position._M_current);
        SignParameter::ConvertToSignature((ByteData *)local_c8,&sign_param);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
        emplace_back<cfd::core::ByteData>(__return_storage_ptr__,(ByteData *)local_c8);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
      }
      else {
LAB_00339359:
        __position._M_current = __position._M_current + 1;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&related_pubkey);
      SignParameter::~SignParameter(&sign_param);
    }
    std::__cxx11::string::~string((string *)&pubkey_hex);
    this_01 = this_01 + 1;
  } while( true );
}

Assistant:

std::vector<ByteData> TransactionApiBase::CreateMultisigSignatureData(
    const std::vector<SignParameter>& sign_list, const Script& redeem_script) {
  std::vector<Pubkey> pubkeys =
      ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script);
  // get signParams from json request
  std::vector<SignParameter> sign_params = sign_list;

  // set signParam to signature_data (only contains relatedPubkey);
  std::vector<ByteData> signature_data;
  for (const Pubkey& pubkey : pubkeys) {
    std::string pubkey_hex = pubkey.GetHex();
    for (auto itr = sign_params.begin(); itr != sign_params.end();) {
      SignParameter sign_param = *itr;
      Pubkey related_pubkey = sign_param.GetRelatedPubkey();
      if ((!related_pubkey.IsValid()) ||
          (related_pubkey.GetHex() != pubkey_hex)) {
        ++itr;
        continue;
      }

      itr = sign_params.erase(itr);
      signature_data.push_back(sign_param.ConvertToSignature());
    }
  }

  // set the others to signature data
  for (const auto& sign_param : sign_params) {
    // related pubkey not found in script
    if (sign_param.GetRelatedPubkey().IsValid()) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateMultisigSignatureData. Missing related pubkey"
          " in script.: relatedPubkey={}, script={}",
          sign_param.GetRelatedPubkey().GetHex(), redeem_script.GetHex());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Missing related pubkey in script."
          " Check your signature and pubkey pair.");
    }
    signature_data.push_back(sign_param.ConvertToSignature());
  }

  return signature_data;
}